

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall vera::Triangle::setTangent(Triangle *this,size_t _index,vec4 *_tangent)

{
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar1;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar2;
  vec4 *pvVar3;
  bool bVar4;
  reference pvVar5;
  __normal_iterator<glm::vec<4,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
  local_38;
  vec<4,_float,_(glm::qualifier)0> *local_30;
  __normal_iterator<glm::vec<4,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
  local_28;
  vec4 *local_20;
  vec4 *_tangent_local;
  size_t _index_local;
  Triangle *this_local;
  
  local_20 = _tangent;
  _tangent_local = (vec4 *)_index;
  _index_local = (size_t)this;
  bVar4 = std::
          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          ::empty(&this->m_tangents);
  pvVar3 = local_20;
  if (bVar4) {
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::resize(&this->m_tangents,3);
    local_28._M_current =
         (vec<4,_float,_(glm::qualifier)0> *)
         std::
         vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
         ::begin(&this->m_tangents);
    local_38._M_current =
         (vec<4,_float,_(glm::qualifier)0> *)
         std::
         vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
         ::begin(&this->m_tangents);
    local_30 = (vec<4,_float,_(glm::qualifier)0> *)
               __gnu_cxx::
               __normal_iterator<glm::vec<4,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
               ::operator+(&local_38,3);
    std::
    fill<__gnu_cxx::__normal_iterator<glm::vec<4,float,(glm::qualifier)0>*,std::vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>>,glm::vec<4,float,(glm::qualifier)0>>
              (local_28,(__normal_iterator<glm::vec<4,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
                         )local_30,local_20);
  }
  else {
    pvVar5 = std::
             vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             ::operator[](&this->m_tangents,(size_type)_tangent_local);
    aVar1 = pvVar3->field_1;
    pvVar5->field_0 = pvVar3->field_0;
    pvVar5->field_1 = aVar1;
    aVar2 = pvVar3->field_3;
    pvVar5->field_2 = pvVar3->field_2;
    pvVar5->field_3 = aVar2;
  }
  return;
}

Assistant:

void Triangle::setTangent(size_t _index, const glm::vec4& _tangent) {
        if (m_tangents.empty()) {
        m_tangents.resize(3);
        std::fill(m_tangents.begin(), m_tangents.begin()+3, _tangent);
    }
    else
        m_tangents[_index] = _tangent;
}